

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O3

Object * __thiscall
ObjTable<QPDFWriter::Object>::large_element(ObjTable<QPDFWriter::Object> *this,size_t idx)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  ulong local_18;
  
  local_18 = idx;
  if (large_element(unsigned_long)::max_size == '\0') {
    large_element();
  }
  if (local_18 < this->min_sparse) {
    this->min_sparse = local_18;
  }
  if (local_18 < large_element::max_size) {
    pmVar1 = std::
             map<unsigned_long,_QPDFWriter::Object,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
             ::operator[](&this->sparse_elements,&local_18);
    return pmVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Impossibly large object id encountered accessing ObjTable");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T&
    large_element(size_t idx)
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < min_sparse) {
            min_sparse = idx;
        }
        if (idx < max_size) {
            return sparse_elements[idx];
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }